

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O2

void deallocateMasterBarrierDisjunctInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)

{
  void *__ptr;
  int i;
  
  if (vMasterBarrierDisjunctsArg != (Vec_Ptr_t *)0x0) {
    for (i = 0; i < vMasterBarrierDisjunctsArg->nSize; i = i + 1) {
      __ptr = Vec_PtrEntry(vMasterBarrierDisjunctsArg,i);
      free(*(void **)((long)__ptr + 8));
      free(__ptr);
    }
    Vec_PtrFree(vMasterBarrierDisjunctsArg);
    return;
  }
  return;
}

Assistant:

void deallocateMasterBarrierDisjunctInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)
{
	Vec_Int_t *vInt;
	int i;

	if(vMasterBarrierDisjunctsArg)
	{
		Vec_PtrForEachEntry(Vec_Int_t *, vMasterBarrierDisjunctsArg, vInt, i)
		{	
			Vec_IntFree(vInt);
		}
		Vec_PtrFree(vMasterBarrierDisjunctsArg);
	}
}